

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::StatementP::StatementP(StatementP *this,Statement *ptr)

{
  Statement *ptr_local;
  StatementP *this_local;
  
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::SharedPtr
            (&this->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>,ptr);
  return;
}

Assistant:

explicit	StatementP			(const Statement* ptr)	: Super(ptr) {}